

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

bool __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::insert_no_grow(hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *this,insert_result *result,uint *k,empty_type *v)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  empty_type *in_RCX;
  uint *in_RDX;
  iterator *in_RSI;
  hash_map_type *in_RDI;
  int orig_index;
  node *pNode;
  int index;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *in_stack_ffffffffffffff90;
  uint *in_stack_ffffffffffffff98;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *in_stack_ffffffffffffffa0;
  iterator local_48;
  value_type *local_38;
  uint local_2c;
  empty_type *local_28;
  uint *local_20;
  iterator *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar3 = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
          ::size(&in_RDI->m_values);
  if (uVar3 == 0) {
    local_1 = false;
  }
  else {
    local_2c = hash_key(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    uVar3 = (uint)((ulong)in_RDI >> 0x20);
    local_38 = &get_node(in_stack_ffffffffffffff90,uVar3)->super_value_type;
    if (local_38->field_0x5 == '\0') {
LAB_00183fbb:
      if (in_RDI->m_num_valid < in_RDI->m_grow_threshold) {
        construct_value_type(local_38,local_20,local_28);
        local_38->field_0x5 = 1;
        in_RDI->m_num_valid = in_RDI->m_num_valid + 1;
        iterator::iterator((iterator *)&stack0xffffffffffffff90,in_RDI,local_2c);
        iterator::operator=(local_18,(iterator *)&stack0xffffffffffffff90);
        *(undefined1 *)&local_18[1].m_pTable = 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      bVar2 = equal_to<unsigned_int>::operator()
                        ((equal_to<unsigned_int> *)&in_RDI->field_0x15,&local_38->first,local_20);
      uVar1 = local_2c;
      if (bVar2) {
        iterator::iterator(&local_48,in_RDI,local_2c);
        iterator::operator=(local_18,&local_48);
        *(undefined1 *)&local_18[1].m_pTable = 0;
        local_1 = true;
      }
      else {
        do {
          if (local_2c == 0) {
            local_2c = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
                       ::size(&in_RDI->m_values);
            local_2c = local_2c - 1;
            local_38 = &get_node(in_stack_ffffffffffffff90,uVar3)->super_value_type;
          }
          else {
            local_2c = local_2c - 1;
            local_38 = local_38 + -1;
          }
          if (uVar1 == local_2c) {
            return false;
          }
          if (local_38->field_0x5 == '\0') goto LAB_00183fbb;
          bVar2 = equal_to<unsigned_int>::operator()
                            ((equal_to<unsigned_int> *)&in_RDI->field_0x15,&local_38->first,local_20
                            );
        } while (!bVar2);
        iterator::iterator((iterator *)&stack0xffffffffffffffa0,in_RDI,local_2c);
        iterator::operator=(local_18,(iterator *)&stack0xffffffffffffffa0);
        *(undefined1 *)&local_18[1].m_pTable = 0;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }